

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void __thiscall sliced_chunk_iterator::load_next(sliced_chunk_iterator *this)

{
  comparer_context *pcVar1;
  FILE *pFVar2;
  size_t sVar3;
  ostream *poVar4;
  void *this_00;
  allocator<char> local_431;
  string local_430;
  string local_410;
  stringstream local_3f0 [8];
  stringstream ss_1;
  ostream local_3e0 [383];
  allocator<char> local_261;
  string local_260;
  string local_240;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [383];
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  uint local_38 [2];
  pair<unsigned_int,_unsigned_int> local_30;
  long local_28;
  long cur;
  size_t res;
  Chunk actual;
  sliced_chunk_iterator *this_local;
  
  actual = (Chunk)this;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
            ((pair<unsigned_int,_unsigned_int> *)&res);
  cur = 0;
  pFVar2 = (FILE *)comparer_context::get_expect(this->ctx);
  local_28 = ftell(pFVar2);
  if (this->end - local_28 < 8) {
    local_38[1] = 0;
    local_38[0] = 0;
    local_30 = std::make_pair<unsigned_int,unsigned_int>(local_38 + 1,local_38);
    std::pair<unsigned_int,_unsigned_int>::operator=(&this->current,&local_30);
    this->endit = true;
  }
  else {
    pFVar2 = (FILE *)comparer_context::get_expect(this->ctx);
    sVar3 = fread(&this->current,4,1,pFVar2);
    cur = sVar3 | cur;
    pFVar2 = (FILE *)comparer_context::get_expect(this->ctx);
    sVar3 = fread(&(this->current).second,4,1,pFVar2);
    cur = sVar3 << 1 | cur;
    pFVar2 = (FILE *)comparer_context::get_actual(this->ctx);
    sVar3 = fread(&res,4,1,pFVar2);
    cur = sVar3 << 2 | cur;
    pFVar2 = (FILE *)comparer_context::get_actual(this->ctx);
    sVar3 = fread((void *)((long)&res + 4),4,1,pFVar2);
    cur = sVar3 << 3 | cur;
    if (cur != 0xf) {
      pcVar1 = this->ctx;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"IO Error reading chunk head, dumps are malformed",&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"<ChunkHead>",&local_91);
      comparer_context::failure(pcVar1,&local_58,&local_90);
    }
    if ((this->current).first != (uint)res) {
      std::__cxx11::stringstream::stringstream(local_220);
      pcVar1 = this->ctx;
      poVar4 = std::operator<<(local_210,"Chunk headers do not match. EXPECT: ");
      this_00 = (void *)std::ostream::operator<<(poVar4,std::hex);
      poVar4 = (ostream *)std::ostream::operator<<(this_00,(this->current).first);
      poVar4 = std::operator<<(poVar4," ACTUAL: ");
      std::ostream::operator<<(poVar4,(uint)res);
      std::__cxx11::stringstream::str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"<ChunkHead>",&local_261);
      comparer_context::failure(pcVar1,&local_240,&local_260);
    }
    if ((this->current).first != (uint)res) {
      std::__cxx11::stringstream::stringstream(local_3f0);
      pcVar1 = this->ctx;
      poVar4 = std::operator<<(local_3e0,"Chunk lengths do not match. EXPECT: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->current).second);
      poVar4 = std::operator<<(poVar4," ACTUAL: ");
      std::ostream::operator<<(poVar4,res._4_4_);
      std::__cxx11::stringstream::str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"<ChunkHead>",&local_431);
      comparer_context::failure(pcVar1,&local_410,&local_430);
    }
    this->next = local_28 + (ulong)(this->current).second + 8;
    comparer_context::push_length(this->ctx,(this->current).second,(int)local_28 + 8);
  }
  return;
}

Assistant:

void load_next() {

        Chunk actual;
        size_t res=0;

        const long cur = ftell(ctx.get_expect());
        if(end-cur<8) {
            current = std::make_pair(0u,0u);
            endit = true;
            return;
        }

        res|=fread(&current.first,4,1,ctx.get_expect());
        res|=fread(&current.second,4,1,ctx.get_expect())    <<1u;
        res|=fread(&actual.first,4,1,ctx.get_actual())      <<2u;
        res|=fread(&actual.second,4,1,ctx.get_actual())     <<3u;

        if(res!=0xf) {
            ctx.failure("IO Error reading chunk head, dumps are malformed","<ChunkHead>");
        }

        if (current.first != actual.first) {
            std::stringstream ss;
            ctx.failure((ss
                <<"Chunk headers do not match. EXPECT: "
                << std::hex << current.first
                <<" ACTUAL: "
                << /*std::hex */actual.first,
                ss.str()),
                "<ChunkHead>");
        }

        if (current.first != actual.first) {
            std::stringstream ss;
            ctx.failure((ss
                <<"Chunk lengths do not match. EXPECT: "
                <<current.second
                <<" ACTUAL: "
                << actual.second,
                ss.str()),
                "<ChunkHead>");
        }

        next = cur+current.second+8;
        ctx.push_length(current.second,cur+8);
    }